

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Resim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  Cec_ParSim_t Pars;
  
  Cec_ManSimSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Fmvh"), iVar2 = globalUtilOptind, iVar1 != 0x46) {
      piVar3 = &Pars.fCheckMiter;
      if (iVar1 != 0x6d) {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            if (pAbc->pGia != (Gia_Man_t *)0x0) {
              iVar2 = Cec_ManSeqResimulateCounter(pAbc->pGia,&Pars,pAbc->pCex);
              pAbc->Status = -(uint)(iVar2 == 0);
              pAbc->nFrames = pAbc->pCex->iFrame;
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Resim(): There is no AIG.\n";
            iVar2 = -1;
            goto LAB_0024ac34;
          }
          goto LAB_0024aba6;
        }
        piVar3 = &Pars.fVerbose;
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      break;
    }
    Pars.nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < Pars.nFrames);
LAB_0024aba6:
  iVar2 = -2;
  Abc_Print(-2,"usage: &resim [-F num] [-mvh]\n");
  Abc_Print(-2,"\t         resimulates equivalence classes using counter-example\n");
  Abc_Print(-2,"\t-F num : the number of additinal frames to simulate [default = %d]\n",
            (ulong)(uint)Pars.nFrames);
  pcVar4 = "miter";
  if (Pars.fCheckMiter == 0) {
    pcVar4 = "circuit";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (Pars.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  pcVar4 = "\t-h     : print the command usage\n";
LAB_0024ac34:
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Resim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSim_t Pars, * pPars = &Pars;
    int c, RetValue;
    Cec_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    RetValue = Cec_ManSeqResimulateCounter( pAbc->pGia, pPars, pAbc->pCex );
    pAbc->Status  = RetValue ? 0 : -1;
    pAbc->nFrames = pAbc->pCex->iFrame;
//    Abc_FrameReplaceCex( pAbc, &pAbc->pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: &resim [-F num] [-mvh]\n" );
    Abc_Print( -2, "\t         resimulates equivalence classes using counter-example\n" );
    Abc_Print( -2, "\t-F num : the number of additinal frames to simulate [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}